

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiDisplayTimingTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)13>_> *
vkt::wsi::anon_unknown_0::createImageView
          (Move<vk::Handle<(vk::HandleType)13>_> *__return_storage_ptr__,DeviceInterface *vkd,
          VkDevice device,VkImage image,VkFormat format)

{
  undefined1 local_80 [8];
  VkImageViewCreateInfo createInfo;
  VkFormat format_local;
  VkDevice device_local;
  DeviceInterface *vkd_local;
  VkImage image_local;
  
  local_80._0_4_ = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
  createInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  createInfo._4_4_ = 0;
  createInfo.pNext._0_4_ = 0;
  createInfo.image.m_internal._0_4_ = 1;
  createInfo._16_8_ = image.m_internal;
  createInfo.image.m_internal._4_4_ = format;
  createInfo._76_4_ = format;
  createInfo._32_16_ = ::vk::makeComponentMappingRGBA();
  createInfo.components.b = VK_COMPONENT_SWIZZLE_ZERO;
  createInfo.components.a = VK_COMPONENT_SWIZZLE_IDENTITY;
  createInfo.subresourceRange.aspectMask = 1;
  createInfo.subresourceRange.baseMipLevel = 0;
  createInfo.subresourceRange.levelCount = 1;
  ::vk::createImageView
            (__return_storage_ptr__,vkd,device,(VkImageViewCreateInfo *)local_80,
             (VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

vk::Move<vk::VkImageView> createImageView (const vk::DeviceInterface&	vkd,
										   vk::VkDevice					device,
										   vk::VkImage					image,
										   vk::VkFormat					format)
{
	const vk::VkImageViewCreateInfo	createInfo =
	{
		vk::VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,
		DE_NULL,

		0u,
		image,
		vk::VK_IMAGE_VIEW_TYPE_2D,
		format,
		vk::makeComponentMappingRGBA(),
		{
			vk::VK_IMAGE_ASPECT_COLOR_BIT,
			0u,
			1u,
			0u,
			1u
		}
	};

	return vk::createImageView(vkd, device, &createInfo, DE_NULL);
}